

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

bool GetLogCategory(LogFlags *flag,string_view str)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  LogFlags LVar4;
  long in_FS_OFFSET;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view str_local;
  
  str_local._M_str = str._M_str;
  str_local._M_len = str._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LVar4 = ALL;
  if (str_local._M_len != 0) {
    __y._M_str = "1";
    __y._M_len = 1;
    bVar2 = std::operator==(str,__y);
    if (!bVar2) {
      __y_00._M_str = "all";
      __y_00._M_len = 3;
      bVar2 = std::operator==(str,__y_00);
      if (!bVar2) {
        cVar3 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BCLog::LogFlags>,std::_Select1st<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>>
                ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BCLog::LogFlags>,std::_Select1st<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,BCLog::LogFlags>>>
                            *)&LOG_CATEGORIES_BY_STR_abi_cxx11_,&str_local);
        if ((_Rb_tree_header *)cVar3._M_node ==
            &LOG_CATEGORIES_BY_STR_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          bVar2 = false;
          goto LAB_001593d1;
        }
        LVar4 = *(LogFlags *)(cVar3._M_node + 2);
      }
    }
  }
  *flag = LVar4;
  bVar2 = true;
LAB_001593d1:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool GetLogCategory(BCLog::LogFlags& flag, std::string_view str)
{
    if (str.empty() || str == "1" || str == "all") {
        flag = BCLog::ALL;
        return true;
    }
    auto it = LOG_CATEGORIES_BY_STR.find(str);
    if (it != LOG_CATEGORIES_BY_STR.end()) {
        flag = it->second;
        return true;
    }
    return false;
}